

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter_model.h
# Opt level: O0

void __thiscall
mp::FlatModel<mp::DefaultFlatModelParams>::
SetObjectiveTo<TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>>
          (FlatModel<mp::DefaultFlatModelParams> *this,
          TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>
          *backend,int i,QuadraticObjective *obj)

{
  bool bVar1;
  size_t sVar2;
  QuadraticObjective *in_RCX;
  QuadraticObjective *in_RSI;
  undefined8 in_RDI;
  BasicFlatModelAPI *unaff_retaddr;
  int iVar3;
  
  iVar3 = (int)((ulong)in_RDI >> 0x20);
  bVar1 = NLObjective::HasExpr(&in_RCX->super_NLObjective);
  if (bVar1) {
    BasicFlatModelAPI::SetNLObjective(unaff_retaddr,iVar3,&in_RSI->super_NLObjective);
  }
  else {
    QuadraticObjective::GetQPTerms(in_RCX);
    sVar2 = QuadTerms::size((QuadTerms *)0x670c9e);
    if (sVar2 == 0) {
      BasicFlatModelAPI::SetLinearObjective(unaff_retaddr,iVar3,(LinearObjective *)in_RSI);
    }
    else {
      BasicFlatModelAPI::SetQuadraticObjective(unaff_retaddr,iVar3,in_RSI);
    }
  }
  return;
}

Assistant:

void SetObjectiveTo(
      Backend& backend, int i, const QuadraticObjective& obj) const {
    if (obj.HasExpr()) {
      assert(obj.GetQPTerms().empty());     // not mixing qudratics and expr
      backend.SetNLObjective(i, obj);
    } else if (obj.GetQPTerms().size())
      backend.SetQuadraticObjective(i, obj);
    else
      backend.SetLinearObjective(i, obj);
  }